

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::MultiAggregationPS::execute
          (MultiAggregationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  fpclass_type fVar4;
  pointer pnVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  int32_t iVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int32_t iVar16;
  int iVar17;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  long lVar19;
  cpp_dec_float<100U,_int,_void> *pcVar20;
  cpp_dec_float<100U,_int,_void> *pcVar21;
  long lVar22;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  cpp_dec_float<100U,_int,_void> local_2d8;
  cpp_dec_float<100U,_int,_void> local_288;
  cpp_dec_float<100U,_int,_void> local_238;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1e0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1d8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_1d0;
  cpp_dec_float<100U,_int,_void> local_1c8;
  fpclass_type local_178;
  int32_t iStack_174;
  undefined8 uStack_170;
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  iVar17 = this->m_i;
  iVar3 = this->m_old_i;
  if (iVar17 != iVar3) {
    pnVar5 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)&pnVar5[iVar17].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 4;
    uVar11 = *(undefined8 *)puVar1;
    uVar12 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 8;
    uVar13 = *(undefined8 *)puVar1;
    uVar14 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
    uVar15 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar15;
    puVar1 = pnVar5[iVar3].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar1 = uVar13;
    *(undefined8 *)(puVar1 + 2) = uVar14;
    puVar1 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = uVar11;
    *(undefined8 *)(puVar1 + 2) = uVar12;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar9;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar17].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar17].m_backend.neg;
    iVar16 = pnVar5[iVar17].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar17].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar16;
    iVar17 = this->m_i;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = this->m_old_i;
    uVar9 = *(undefined8 *)&pnVar5[iVar17].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 4;
    uVar11 = *(undefined8 *)puVar1;
    uVar12 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 8;
    uVar13 = *(undefined8 *)puVar1;
    uVar14 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
    uVar15 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar15;
    puVar1 = pnVar5[iVar3].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar1 = uVar13;
    *(undefined8 *)(puVar1 + 2) = uVar14;
    puVar1 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = uVar11;
    *(undefined8 *)(puVar1 + 2) = uVar12;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar9;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar17].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar17].m_backend.neg;
    iVar16 = pnVar5[iVar17].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar17].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar16;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  iVar17 = this->m_j;
  iVar3 = this->m_old_j;
  if (iVar17 != iVar3) {
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)&pnVar5[iVar17].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 4;
    uVar11 = *(undefined8 *)puVar1;
    uVar12 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 8;
    uVar13 = *(undefined8 *)puVar1;
    uVar14 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
    uVar15 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar15;
    puVar1 = pnVar5[iVar3].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar1 = uVar13;
    *(undefined8 *)(puVar1 + 2) = uVar14;
    puVar1 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = uVar11;
    *(undefined8 *)(puVar1 + 2) = uVar12;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar9;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar17].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar17].m_backend.neg;
    iVar16 = pnVar5[iVar17].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar17].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar16;
    iVar17 = this->m_j;
    pnVar5 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = this->m_old_j;
    uVar11 = *(undefined8 *)&pnVar5[iVar17].m_backend.data;
    uVar12 = *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)puVar1;
    uVar10 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 8;
    uVar13 = *(undefined8 *)puVar1;
    uVar14 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
    uVar15 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar15;
    puVar1 = pnVar5[iVar3].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar1 = uVar13;
    *(undefined8 *)(puVar1 + 2) = uVar14;
    puVar1 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = uVar9;
    *(undefined8 *)(puVar1 + 2) = uVar10;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar11;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar12;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar17].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar17].m_backend.neg;
    iVar16 = pnVar5[iVar17].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar17].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar16;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  local_1e0 = s;
  local_1d8 = r;
  local_1d0 = cStatus;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_128,0.0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_80,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  if (0 < (this->m_row).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar22 = 0;
    lVar19 = 0;
    do {
      pNVar6 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar6->val + 1) + lVar22) != this->m_j) {
        pcVar20 = &(x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(int *)((long)(&pNVar6->val + 1) + lVar22)].m_backend;
        pcVar18 = (cpp_dec_float<100U,_int,_void> *)
                  ((long)(pNVar6->val).m_backend.data._M_elems + lVar22);
        local_2d8.fpclass = cpp_dec_float_finite;
        local_2d8.prec_elem = 0x10;
        local_2d8.data._M_elems[0] = 0;
        local_2d8.data._M_elems[1] = 0;
        local_2d8.data._M_elems[2] = 0;
        local_2d8.data._M_elems[3] = 0;
        local_2d8.data._M_elems[4] = 0;
        local_2d8.data._M_elems[5] = 0;
        local_2d8.data._M_elems[6] = 0;
        local_2d8.data._M_elems[7] = 0;
        local_2d8.data._M_elems[8] = 0;
        local_2d8.data._M_elems[9] = 0;
        local_2d8.data._M_elems[10] = 0;
        local_2d8.data._M_elems[0xb] = 0;
        local_2d8.data._M_elems[0xc] = 0;
        local_2d8.data._M_elems[0xd] = 0;
        local_2d8.data._M_elems._56_5_ = 0;
        local_2d8.data._M_elems[0xf]._1_3_ = 0;
        local_2d8.exp = 0;
        local_2d8.neg = false;
        pcVar21 = pcVar18;
        if ((&local_2d8 != pcVar20) && (pcVar21 = pcVar20, pcVar18 != &local_2d8)) {
          local_2d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
          local_2d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
          local_2d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
          local_2d8.data._M_elems._24_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 6);
          local_2d8.data._M_elems._32_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
          local_2d8.data._M_elems._40_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 10);
          local_2d8.data._M_elems._48_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
          uVar9 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
          local_2d8.data._M_elems._56_5_ = SUB85(uVar9,0);
          local_2d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
          local_2d8.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar22);
          local_2d8.neg = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar22 + 4);
          local_2d8._72_8_ = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar22 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&local_2d8,pcVar21);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_128,&local_2d8);
      }
      lVar19 = lVar19 + 1;
      lVar22 = lVar22 + 0x54;
    } while (lVar19 < (this->m_row).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  uVar9 = *(undefined8 *)(this->m_const).m_backend.data._M_elems;
  uVar10 = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 0xe);
  local_2d8.data._M_elems._48_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 0xc);
  local_2d8.data._M_elems._56_5_ = SUB85(uVar10,0);
  local_2d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_2d8.data._M_elems._32_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 8);
  local_2d8.data._M_elems._40_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 10);
  local_2d8.data._M_elems._16_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 4);
  local_2d8.data._M_elems._24_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 6);
  local_2d8.data._M_elems[0] = (uint)uVar9;
  local_2d8.data._M_elems[1] = SUB84(uVar9,4);
  uVar10 = local_2d8.data._M_elems._0_8_;
  local_2d8.data._M_elems._8_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 2);
  local_2d8.neg = (this->m_const).m_backend.neg;
  local_2d8.exp = (this->m_const).m_backend.exp;
  fVar4 = (this->m_const).m_backend.fpclass;
  iVar7 = (this->m_const).m_backend.prec_elem;
  local_2d8.fpclass = fVar4;
  local_2d8.prec_elem = iVar7;
  if ((local_2d8.neg == true) &&
     (local_2d8.data._M_elems[0] = (uint)uVar9,
     local_2d8.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
    local_2d8.neg = false;
  }
  uVar9._5_3_ = local_128.data._M_elems[0xf]._1_3_;
  uVar9._0_5_ = local_128.data._M_elems._56_5_;
  local_238.data._M_elems[0xc] = local_128.data._M_elems[0xc];
  local_238.data._M_elems[0xd] = local_128.data._M_elems[0xd];
  local_238.data._M_elems[0xe] = local_128.data._M_elems[0xe];
  local_238.data._M_elems[0xf] = SUB84(uVar9,4);
  local_238.data._M_elems[8] = local_128.data._M_elems[8];
  local_238.data._M_elems[9] = local_128.data._M_elems[9];
  local_238.data._M_elems[10] = local_128.data._M_elems[10];
  local_238.data._M_elems[0xb] = local_128.data._M_elems[0xb];
  local_238.data._M_elems[4] = local_128.data._M_elems[4];
  local_238.data._M_elems[5] = local_128.data._M_elems[5];
  local_238.data._M_elems[6] = local_128.data._M_elems[6];
  local_238.data._M_elems[7] = local_128.data._M_elems[7];
  local_238.data._M_elems[0] = local_128.data._M_elems[0];
  local_238.data._M_elems[1] = local_128.data._M_elems[1];
  uVar9 = local_238.data._M_elems._0_8_;
  local_238.data._M_elems[2] = local_128.data._M_elems[2];
  local_238.data._M_elems[3] = local_128.data._M_elems[3];
  local_238.exp = local_128.exp;
  local_238.neg = local_128.neg;
  local_238.fpclass = local_128.fpclass;
  local_238.prec_elem = local_128.prec_elem;
  if ((local_128.neg != false) &&
     (local_238.data._M_elems[0] = local_128.data._M_elems[0],
     local_238.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite)) {
    local_238.neg = (bool)(local_128.neg ^ 1);
  }
  local_238.data._M_elems._0_8_ = uVar9;
  if (local_128.fpclass == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) {
    bVar8 = false;
  }
  else {
    local_2d8.data._M_elems._0_8_ = uVar10;
    iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_2d8,&local_238);
    bVar8 = 0 < iVar17;
  }
  pcVar18 = &local_238;
  if (bVar8) {
    pcVar18 = &local_2d8;
  }
  local_1c8.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
  local_1c8.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
  local_1c8.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
  local_1c8.data._M_elems._24_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 6);
  local_1c8.data._M_elems._32_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
  local_1c8.data._M_elems._40_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 10);
  local_1c8.data._M_elems._48_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
  local_1c8.data._M_elems._56_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
  pcVar18 = &local_238;
  if (bVar8) {
    pcVar18 = &local_2d8;
  }
  local_1c8.exp = pcVar18->exp;
  pcVar18 = &local_238;
  if (bVar8) {
    pcVar18 = &local_2d8;
  }
  local_1c8.neg = pcVar18->neg;
  pcVar18 = &local_238;
  if (bVar8) {
    pcVar18 = &local_2d8;
  }
  local_1c8.fpclass = pcVar18->fpclass;
  pcVar18 = &local_238;
  if (bVar8) {
    pcVar18 = &local_2d8;
  }
  local_1c8.prec_elem = pcVar18->prec_elem;
  if (local_1c8.fpclass != cpp_dec_float_NaN) {
    local_2d8.fpclass = cpp_dec_float_finite;
    local_2d8.prec_elem = 0x10;
    local_2d8.data._M_elems[0] = 0;
    local_2d8.data._M_elems[1] = 0;
    local_2d8.data._M_elems[2] = 0;
    local_2d8.data._M_elems[3] = 0;
    local_2d8.data._M_elems[4] = 0;
    local_2d8.data._M_elems[5] = 0;
    local_2d8.data._M_elems[6] = 0;
    local_2d8.data._M_elems[7] = 0;
    local_2d8.data._M_elems[8] = 0;
    local_2d8.data._M_elems[9] = 0;
    local_2d8.data._M_elems[10] = 0;
    local_2d8.data._M_elems[0xb] = 0;
    local_2d8.data._M_elems[0xc] = 0;
    local_2d8.data._M_elems[0xd] = 0;
    local_2d8.data._M_elems._56_5_ = 0;
    local_2d8.data._M_elems[0xf]._1_3_ = 0;
    local_2d8.exp = 0;
    local_2d8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_2d8,1.0);
    iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_1c8,&local_2d8);
    if (iVar17 < 0) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_1c8,1.0);
    }
  }
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 0x10;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems[8] = 0;
  local_2d8.data._M_elems[9] = 0;
  local_2d8.data._M_elems[10] = 0;
  local_2d8.data._M_elems[0xb] = 0;
  local_2d8.data._M_elems[0xc] = 0;
  local_2d8.data._M_elems[0xd] = 0;
  local_2d8.data._M_elems._56_5_ = 0;
  local_2d8.data._M_elems[0xf]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_2d8,&(this->m_const).m_backend,&local_1c8);
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 0x10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems[6] = 0;
  local_288.data._M_elems[7] = 0;
  local_288.data._M_elems[8] = 0;
  local_288.data._M_elems[9] = 0;
  local_288.data._M_elems[10] = 0;
  local_288.data._M_elems[0xb] = 0;
  local_288.data._M_elems[0xc] = 0;
  local_288.data._M_elems[0xd] = 0;
  local_288.data._M_elems._56_5_ = 0;
  local_288.data._M_elems[0xf]._1_3_ = 0;
  local_288.exp = 0;
  local_288.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_288,&local_128,&local_1c8);
  local_238.data._M_elems[0xf]._1_3_ = local_2d8.data._M_elems[0xf]._1_3_;
  local_238.data._M_elems._56_5_ = local_2d8.data._M_elems._56_5_;
  local_238.data._M_elems[0] = local_2d8.data._M_elems[0];
  local_238.data._M_elems[1] = local_2d8.data._M_elems[1];
  local_238.data._M_elems[2] = local_2d8.data._M_elems[2];
  local_238.data._M_elems[3] = local_2d8.data._M_elems[3];
  local_238.data._M_elems[4] = local_2d8.data._M_elems[4];
  local_238.data._M_elems[5] = local_2d8.data._M_elems[5];
  local_238.data._M_elems[6] = local_2d8.data._M_elems[6];
  local_238.data._M_elems[7] = local_2d8.data._M_elems[7];
  local_238.data._M_elems[8] = local_2d8.data._M_elems[8];
  local_238.data._M_elems[9] = local_2d8.data._M_elems[9];
  local_238.data._M_elems[10] = local_2d8.data._M_elems[10];
  local_238.data._M_elems[0xb] = local_2d8.data._M_elems[0xb];
  local_238.data._M_elems[0xc] = local_2d8.data._M_elems[0xc];
  local_238.data._M_elems[0xd] = local_2d8.data._M_elems[0xd];
  local_238.exp = local_2d8.exp;
  local_238.neg = local_2d8.neg;
  local_238.fpclass = local_2d8.fpclass;
  local_238.prec_elem = local_2d8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_238,&local_288)
  ;
  uVar10 = local_238._72_8_;
  bVar8 = local_238.neg;
  iVar17 = local_238.exp;
  local_168[0] = local_238.data._M_elems[0];
  local_168[1] = local_238.data._M_elems[1];
  auStack_160[0] = local_238.data._M_elems[2];
  auStack_160[1] = local_238.data._M_elems[3];
  local_158[0] = local_238.data._M_elems[4];
  local_158[1] = local_238.data._M_elems[5];
  auStack_150[0] = local_238.data._M_elems[6];
  auStack_150[1] = local_238.data._M_elems[7];
  local_148 = local_238.data._M_elems[8];
  uStack_144 = local_238.data._M_elems[9];
  uStack_140 = local_238.data._M_elems[10];
  uStack_13c = local_238.data._M_elems[0xb];
  local_138 = local_238.data._M_elems[0xc];
  uStack_134 = local_238.data._M_elems[0xd];
  uStack_130 = local_238.data._M_elems[0xe];
  uStack_12c = local_238.data._M_elems[0xf];
  local_178 = local_238.fpclass;
  iStack_174 = local_238.prec_elem;
  uStack_170 = 0;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_d0,this);
  uVar11 = local_238._72_8_;
  local_2d8.data._M_elems[9] = uStack_144;
  local_2d8.data._M_elems[8] = local_148;
  local_2d8.data._M_elems[0xb] = uStack_13c;
  local_2d8.data._M_elems[10] = uStack_140;
  local_2d8.data._M_elems[0xd] = uStack_134;
  local_2d8.data._M_elems[0xc] = local_138;
  local_2d8.data._M_elems._56_5_ = SUB85(CONCAT44(uStack_12c,uStack_130),0);
  local_2d8.data._M_elems[0xf]._1_3_ = (undefined3)(uStack_12c >> 8);
  local_2d8.data._M_elems[4] = local_158[0];
  local_2d8.data._M_elems[5] = local_158[1];
  local_2d8.data._M_elems[6] = auStack_150[0];
  local_2d8.data._M_elems[7] = auStack_150[1];
  local_2d8.data._M_elems[0] = local_168[0];
  local_2d8.data._M_elems[1] = local_168[1];
  uVar9 = local_2d8.data._M_elems._0_8_;
  local_2d8.data._M_elems[2] = auStack_160[0];
  local_2d8.data._M_elems[3] = auStack_160[1];
  local_2d8.exp = iVar17;
  local_2d8.neg = bVar8;
  local_238.fpclass = (fpclass_type)uVar10;
  local_238.prec_elem = SUB84(uVar10,4);
  local_2d8.fpclass = local_238.fpclass;
  local_2d8.prec_elem = local_238.prec_elem;
  if ((bVar8 == true) &&
     (local_2d8.data._M_elems[0] = local_168[0],
     local_2d8.data._M_elems[0] != 0 || local_178 != cpp_dec_float_finite)) {
    local_2d8.neg = false;
  }
  local_2d8.data._M_elems._0_8_ = uVar9;
  local_238._72_8_ = uVar11;
  if (((local_178 != cpp_dec_float_NaN) && (local_d0.fpclass != cpp_dec_float_NaN)) &&
     (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_2d8,&local_d0), iVar17 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_238,0.0);
  }
  local_288.data._M_elems[0] = local_238.data._M_elems[0];
  local_288.data._M_elems[1] = local_238.data._M_elems[1];
  local_288.data._M_elems[2] = local_238.data._M_elems[2];
  local_288.data._M_elems[3] = local_238.data._M_elems[3];
  local_288.data._M_elems[4] = local_238.data._M_elems[4];
  local_288.data._M_elems[5] = local_238.data._M_elems[5];
  local_288.data._M_elems[6] = local_238.data._M_elems[6];
  local_288.data._M_elems[7] = local_238.data._M_elems[7];
  local_288.data._M_elems[8] = local_238.data._M_elems[8];
  local_288.data._M_elems[9] = local_238.data._M_elems[9];
  local_288.data._M_elems[10] = local_238.data._M_elems[10];
  local_288.data._M_elems[0xb] = local_238.data._M_elems[0xb];
  local_288.data._M_elems[0xc] = local_238.data._M_elems[0xc];
  local_288.data._M_elems[0xd] = local_238.data._M_elems[0xd];
  local_288.data._M_elems._56_5_ = local_238.data._M_elems._56_5_;
  local_288.data._M_elems[0xf]._1_3_ = local_238.data._M_elems[0xf]._1_3_;
  local_288.exp = local_238.exp;
  local_288.neg = local_238.neg;
  local_288.fpclass = local_238.fpclass;
  local_288.prec_elem = local_238.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_288,&local_1c8)
  ;
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 0x10;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems[8] = 0;
  local_2d8.data._M_elems[9] = 0;
  local_2d8.data._M_elems[10] = 0;
  local_2d8.data._M_elems[0xb] = 0;
  local_2d8.data._M_elems[0xc] = 0;
  local_2d8.data._M_elems[0xd] = 0;
  local_2d8.data._M_elems._56_5_ = 0;
  local_2d8.data._M_elems[0xf]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_2d8,&local_288,&local_80);
  iVar17 = this->m_j;
  pnVar5 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = local_2d8.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(local_2d8.data._M_elems[0xf]._1_3_,local_2d8.data._M_elems._56_5_);
  puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = local_2d8.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = local_2d8.data._M_elems._40_8_;
  puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_2d8.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = local_2d8.data._M_elems._24_8_;
  *(undefined8 *)&pnVar5[iVar17].m_backend.data = local_2d8.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2) = local_2d8.data._M_elems._8_8_;
  pnVar5[iVar17].m_backend.exp = local_2d8.exp;
  pnVar5[iVar17].m_backend.neg = local_2d8.neg;
  pnVar5[iVar17].m_backend.fpclass = local_2d8.fpclass;
  pnVar5[iVar17].m_backend.prec_elem = local_2d8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)
             ((local_1e0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_i),0.0);
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 0x10;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems[8] = 0;
  local_2d8.data._M_elems[9] = 0;
  local_2d8.data._M_elems[10] = 0;
  local_2d8.data._M_elems[0xb] = 0;
  local_2d8.data._M_elems[0xc] = 0;
  local_2d8.data._M_elems[0xd] = 0;
  local_2d8.data._M_elems._56_5_ = 0;
  local_2d8.data._M_elems[0xf]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_2d8,0.0);
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar22 = 0;
    lVar19 = 0;
    do {
      pNVar6 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar6->val + 1) + lVar22) != this->m_i) {
        pcVar20 = &(y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(int *)((long)(&pNVar6->val + 1) + lVar22)].m_backend;
        pcVar18 = (cpp_dec_float<100U,_int,_void> *)
                  ((long)(pNVar6->val).m_backend.data._M_elems + lVar22);
        local_288.fpclass = cpp_dec_float_finite;
        local_288.prec_elem = 0x10;
        local_288.data._M_elems[0] = 0;
        local_288.data._M_elems[1] = 0;
        local_288.data._M_elems[2] = 0;
        local_288.data._M_elems[3] = 0;
        local_288.data._M_elems[4] = 0;
        local_288.data._M_elems[5] = 0;
        local_288.data._M_elems[6] = 0;
        local_288.data._M_elems[7] = 0;
        local_288.data._M_elems[8] = 0;
        local_288.data._M_elems[9] = 0;
        local_288.data._M_elems[10] = 0;
        local_288.data._M_elems[0xb] = 0;
        local_288.data._M_elems[0xc] = 0;
        local_288.data._M_elems[0xd] = 0;
        local_288.data._M_elems._56_5_ = 0;
        local_288.data._M_elems[0xf]._1_3_ = 0;
        local_288.exp = 0;
        local_288.neg = false;
        pcVar21 = pcVar18;
        if ((&local_288 != pcVar20) && (pcVar21 = pcVar20, pcVar18 != &local_288)) {
          local_288.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
          local_288.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
          local_288.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
          local_288.data._M_elems._24_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 6);
          local_288.data._M_elems._32_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
          local_288.data._M_elems._40_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 10);
          local_288.data._M_elems._48_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
          uVar9 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
          local_288.data._M_elems._56_5_ = SUB85(uVar9,0);
          local_288.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
          local_288.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar22);
          local_288.neg = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar22 + 4);
          local_288._72_8_ = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar22 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&local_288,pcVar21);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_2d8,&local_288);
      }
      lVar19 = lVar19 + 1;
      lVar22 = lVar22 + 0x54;
    } while (lVar19 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 0x10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems[6] = 0;
  local_288.data._M_elems[7] = 0;
  local_288.data._M_elems[8] = 0;
  local_288.data._M_elems[9] = 0;
  local_288.data._M_elems[10] = 0;
  local_288.data._M_elems[0xb] = 0;
  local_288.data._M_elems[0xc] = 0;
  local_288.data._M_elems[0xd] = 0;
  local_288.data._M_elems._56_5_ = 0;
  local_288.data._M_elems[0xf]._1_3_ = 0;
  local_288.exp = 0;
  local_288.neg = false;
  if (&local_288 != &(this->m_obj).m_backend) {
    local_288.data._M_elems._0_8_ = *(undefined8 *)(this->m_obj).m_backend.data._M_elems;
    local_288.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
    local_288.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
    local_288.data._M_elems._24_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
    local_288.data._M_elems._32_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
    local_288.data._M_elems._40_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 10);
    local_288.data._M_elems._48_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 0xc);
    uVar9 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 0xe);
    local_288.data._M_elems._56_5_ = SUB85(uVar9,0);
    local_288.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
    local_288.exp = (this->m_obj).m_backend.exp;
    local_288.neg = (this->m_obj).m_backend.neg;
    local_288.fpclass = (this->m_obj).m_backend.fpclass;
    local_288.prec_elem = (this->m_obj).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_288,&local_2d8)
  ;
  local_238.data._M_elems[0xf]._1_3_ = local_288.data._M_elems[0xf]._1_3_;
  local_238.data._M_elems._56_5_ = local_288.data._M_elems._56_5_;
  local_238.data._M_elems[0] = local_288.data._M_elems[0];
  local_238.data._M_elems[1] = local_288.data._M_elems[1];
  local_238.data._M_elems[2] = local_288.data._M_elems[2];
  local_238.data._M_elems[3] = local_288.data._M_elems[3];
  local_238.data._M_elems[4] = local_288.data._M_elems[4];
  local_238.data._M_elems[5] = local_288.data._M_elems[5];
  local_238.data._M_elems[6] = local_288.data._M_elems[6];
  local_238.data._M_elems[7] = local_288.data._M_elems[7];
  local_238.data._M_elems[8] = local_288.data._M_elems[8];
  local_238.data._M_elems[9] = local_288.data._M_elems[9];
  local_238.data._M_elems[10] = local_288.data._M_elems[10];
  local_238.data._M_elems[0xb] = local_288.data._M_elems[0xb];
  local_238.data._M_elems[0xc] = local_288.data._M_elems[0xc];
  local_238.data._M_elems[0xd] = local_288.data._M_elems[0xd];
  local_238.exp = local_288.exp;
  local_238.neg = local_288.neg;
  local_238.fpclass = local_288.fpclass;
  local_238.prec_elem = local_288.prec_elem;
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 0x10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems[6] = 0;
  local_288.data._M_elems[7] = 0;
  local_288.data._M_elems[8] = 0;
  local_288.data._M_elems[9] = 0;
  local_288.data._M_elems[10] = 0;
  local_288.data._M_elems[0xb] = 0;
  local_288.data._M_elems[0xc] = 0;
  local_288.data._M_elems[0xd] = 0;
  local_288.data._M_elems._56_5_ = 0;
  local_288.data._M_elems[0xf]._1_3_ = 0;
  local_288.exp = 0;
  local_288.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_288,&local_238,&local_80);
  iVar17 = this->m_i;
  pnVar5 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = local_288.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(local_288.data._M_elems[0xf]._1_3_,local_288.data._M_elems._56_5_);
  puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = local_288.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = local_288.data._M_elems._40_8_;
  puVar1 = pnVar5[iVar17].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_288.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = local_288.data._M_elems._24_8_;
  *(undefined8 *)&pnVar5[iVar17].m_backend.data = local_288.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2) = local_288.data._M_elems._8_8_;
  pnVar5[iVar17].m_backend.exp = local_288.exp;
  pnVar5[iVar17].m_backend.neg = local_288.neg;
  pnVar5[iVar17].m_backend.fpclass = local_288.fpclass;
  pnVar5[iVar17].m_backend.prec_elem = local_288.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)
             ((local_1d8->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  local_1d0->data[this->m_j] = BASIC;
  if (this->m_eqCons == false) {
    if (this->m_onLhs == true) {
      rStatus->data[this->m_i] = ON_LOWER;
    }
    else {
      rStatus->data[this->m_i] = ON_UPPER;
    }
  }
  else {
    rStatus->data[this->m_i] = FIXED;
  }
  return;
}

Assistant:

void SPxMainSM<R>::MultiAggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_const, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_const / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = 0.0;

#ifndef NDEBUG

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
      SPX_MSG_ERROR(std::cerr << "numerical violation in original space due to MultiAggregation\n";)
#endif

      // dual:
      R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}